

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O3

void init_grid(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar4 = 0;
  lVar2 = 0;
  do {
    dVar8 = (double)((int)lVar2 + -0x19);
    iVar3 = -0x19;
    lVar5 = 0;
    do {
      dVar6 = SQRT((double)iVar3 * (double)iVar3 + dVar8 * dVar8);
      dVar7 = 0.0;
      if (dVar6 < 2.5) {
        dVar7 = cos(dVar6 * 10.0 * 0.015707963267948967);
        dVar7 = dVar7 * -100.0;
      }
      lVar1 = lVar5 + lVar4;
      *(double *)((long)p[0] + lVar1) = dVar7;
      *(undefined8 *)((long)vx[0] + lVar1) = 0;
      *(undefined8 *)((long)vy[0] + lVar1) = 0;
      iVar3 = iVar3 + 1;
      lVar5 = lVar5 + 400;
    } while (lVar5 != 20000);
    lVar2 = lVar2 + 1;
    lVar4 = lVar4 + 8;
  } while (lVar2 != 0x32);
  return;
}

Assistant:

void init_grid(void)
{
    int x, y;
    double dx, dy, d;

    for (y = 0; y < GRIDH;  y++)
    {
        for (x = 0; x < GRIDW;  x++)
        {
            dx = (double) (x - GRIDW / 2);
            dy = (double) (y - GRIDH / 2);
            d = sqrt(dx * dx + dy * dy);
            if (d < 0.1 * (double) (GRIDW / 2))
            {
                d = d * 10.0;
                p[x][y] = -cos(d * (M_PI / (double)(GRIDW * 4))) * 100.0;
            }
            else
                p[x][y] = 0.0;

            vx[x][y] = 0.0;
            vy[x][y] = 0.0;
        }
    }
}